

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int pushBoundaryTest(char *filename,char *result,char *err,int options)

{
  long lVar1;
  undefined8 uVar2;
  char *filename_00;
  int iVar3;
  code *pcVar4;
  size_t sVar5;
  ulong uVar6;
  code *pcVar7;
  undefined8 *puVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  byte *pbVar15;
  bool bVar16;
  int size;
  char *base;
  char *local_168;
  long local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  ulong local_140;
  long local_138;
  code *local_130 [14];
  byte local_c0 [8];
  undefined8 local_b8;
  code *local_b0;
  code *local_a8;
  code *local_98;
  code *local_90;
  code *local_68;
  byte local_48 [8];
  undefined8 local_40 [2];
  
  iVar3 = strcmp(filename,"./test/HTML/xml-declaration-1.html");
  if (iVar3 == 0) {
    return 0;
  }
  nb_tests = nb_tests + 1;
  memset(local_130,0,0x100);
  if (((uint)options >> 0x1e & 1) == 0) {
    puVar8 = local_40;
    pbVar15 = local_48;
    xmlSAXVersion(local_130,2);
    pcVar4 = endElementNsBnd;
    pcVar7 = startElementNsBnd;
  }
  else {
    puVar8 = &local_b8;
    pbVar15 = local_c0;
    xmlSAX2InitHtmlDefaultSAXHandler(local_130);
    pcVar4 = endElementBnd;
    pcVar7 = startElementBnd;
  }
  *(code **)pbVar15 = pcVar7;
  *puVar8 = pcVar4;
  local_130[0] = internalSubsetBnd;
  local_b0 = referenceBnd;
  local_a8 = charactersBnd;
  local_68 = cdataBlockBnd;
  local_98 = processingInstructionBnd;
  local_90 = commentBnd;
  iVar3 = loadMem(filename,&base,&size);
  if (iVar3 == 0) {
    lVar10 = 1;
    local_158 = base;
    local_168 = filename;
    local_150 = err;
    local_148 = result;
    if (((uint)options >> 0x1e & 1) == 0) {
      local_160 = xmlCreatePushParserCtxt(local_130,0,base,1,filename);
      local_140 = 1;
    }
    else {
      local_160 = htmlCreatePushParserCtxt(local_130,0,base,1,filename,0);
      local_140 = 0x20;
    }
    xmlCtxtSetErrorHandler(local_160,testStructuredErrorHandler,0);
    xmlCtxtUseOptions(local_160);
    local_138 = (long)size;
    uVar14 = 0;
    pbVar9 = (byte *)0x0;
    uVar6 = 0;
    while( true ) {
      uVar12 = 1;
      if (((local_138 <= lVar10) || (1 < (int)uVar6)) || (uVar14 != 0)) break;
      lVar1 = *(long *)(local_160 + 0x38);
      if (*(int *)(local_160 + 0x110) == 7) {
        pbVar15 = *(byte **)(lVar1 + 0x20);
        if (pbVar15 < *(byte **)(lVar1 + 0x28)) {
          uVar11 = (uint)*pbVar15;
        }
        else {
          uVar11 = (uint)local_158[lVar10];
        }
        if (((uint)options >> 0x1e & 1) == 0) {
          bVar16 = uVar11 != 0x26 && uVar11 != 0x3c;
        }
        else {
          bVar16 = uVar11 != 0x3c || *(int *)(local_160 + 0x2f0) != 0;
        }
        bVar16 = (bool)(bVar16 ^ 1);
      }
      else {
        pbVar15 = *(byte **)(lVar1 + 0x20);
        bVar16 = true;
      }
      pbVar15 = pbVar15 + (*(long *)(lVar1 + 0x40) - *(long *)(lVar1 + 0x18));
      pushBoundaryCount = 0;
      pushBoundaryRefCount = 0;
      pushBoundaryCharsCount = 0;
      pushBoundaryCDataCount = 0;
      if (((uint)options >> 0x1e & 1) == 0) {
        xmlParseChunk(local_160,local_158 + lVar10,1,(int)local_138 <= (int)lVar10 + 1);
      }
      else {
        htmlParseChunk();
      }
      if (pushBoundaryRefCount < 1) {
        uVar11 = pushBoundaryCount;
        if (1 < pushBoundaryCharsCount) {
          if (((uint)options >> 0x1e & 1) == 0) {
            uVar12 = (ulong)(pushBoundaryCount - 1);
            goto LAB_00109464;
          }
          uVar11 = (pushBoundaryCount - pushBoundaryCharsCount) + 1;
        }
        uVar12 = (ulong)uVar11;
        if ((1 < pushBoundaryCDataCount & (byte)((uint)options >> 0x1e)) == 1) {
          uVar12 = (ulong)((uVar11 - pushBoundaryCDataCount) + 1);
        }
      }
LAB_00109464:
      lVar1 = *(long *)(local_160 + 0x38);
      pcVar13 = *(char **)(lVar1 + 0x20);
      pbVar9 = (byte *)(pcVar13 + (*(long *)(lVar1 + 0x40) - *(long *)(lVar1 + 0x18)));
      iVar3 = *(int *)(local_160 + 0x110);
      if ((iVar3 == 3) || (pbVar9 < (byte *)0x4)) {
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        if (pbVar9 != pbVar15) {
          lVar1 = *(long *)(lVar1 + 0x28);
          if ((((uint)options >> 0x1e & 1) == 0) || (uVar6 = 3, iVar3 != 9)) {
            if (bVar16) {
              uVar6 = (ulong)(iVar3 == 8) * 5;
            }
            else if ((((uint)options >> 0x1e & 1) == 0) || (*(int *)(local_160 + 0x2f0) == 0)) {
              uVar6 = 1;
              if ((*pcVar13 != '<') && (uVar6 = local_140, *pcVar13 != '&')) {
                uVar6 = 3;
              }
            }
            else {
              sVar5 = strlen(*(char **)(local_160 + 0x120));
              uVar6 = sVar5 + 2;
            }
          }
          uVar14 = lVar1 - (long)pcVar13;
          if (uVar14 <= uVar6) {
            uVar14 = 0;
          }
        }
      }
      lVar10 = lVar10 + 1;
      uVar6 = uVar12;
    }
    if (((uint)options >> 0x1e & 1) == 0) {
      bVar16 = *(int *)(local_160 + 0x18) == 0;
    }
    else {
      bVar16 = false;
    }
    uVar2 = *(undefined8 *)(local_160 + 0x10);
    xmlFreeParserCtxt();
    free(local_158);
    filename = local_168;
    if (1 < (int)uVar6) {
      xmlFreeDoc(uVar2);
      fprintf(_stderr,"Failed push boundary callback test (%d@%lu-%lu): %s\n",uVar6,pbVar15,pbVar9,
              local_168);
      return -1;
    }
    if (uVar14 != 0) {
      xmlFreeDoc(uVar2);
      fprintf(_stderr,"Failed push boundary buffer test (%lu@%lu): %s\n",uVar14,pbVar9,local_168);
      return -1;
    }
    if (bVar16) {
      xmlFreeDoc(uVar2);
      pcVar13 = "Failed to parse %s\n";
      filename = local_168;
    }
    else {
      if (((uint)options >> 0x1e & 1) == 0) {
        xmlDocDumpMemory(uVar2,&base,&size);
      }
      else {
        htmlDocDumpMemory();
      }
      filename_00 = local_148;
      pcVar13 = local_150;
      xmlFreeDoc(uVar2);
      iVar3 = compareFileMem(filename_00,base,size);
      if ((base == (char *)0x0) || (iVar3 != 0)) {
        if (base != (char *)0x0) {
          (*_xmlFree)();
        }
        fprintf(_stderr,"Result for %s failed in %s\n",filename,filename_00);
        return -1;
      }
      (*_xmlFree)();
      if (pcVar13 == (char *)0x0) {
        return 0;
      }
      iVar3 = compareFileMem(pcVar13,testErrors,testErrorsSize);
      if (iVar3 == 0) {
        return 0;
      }
      pcVar13 = "Error for %s failed\n";
    }
  }
  else {
    pcVar13 = "Failed to load %s\n";
  }
  fprintf(_stderr,pcVar13,filename);
  return -1;
}

Assistant:

static int
pushBoundaryTest(const char *filename, const char *result,
                 const char *err ATTRIBUTE_UNUSED,
                 int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    xmlSAXHandler bndSAX;
    const char *base;
    int size, res, numCallbacks;
    int cur = 0;
    unsigned long avail, oldConsumed, consumed;

    /*
     * HTML encoding detection doesn't work when data is fed bytewise.
     */
    if (strcmp(filename, "./test/HTML/xml-declaration-1.html") == 0)
        return(0);

    /*
     * If the parser made progress, check that exactly one construct was
     * processed and that the input buffer is (almost) empty.
     * Since we use a chunk size of 1, this tests whether content is
     * processed as early as possible.
     */

    nb_tests++;

    memset(&bndSAX, 0, sizeof(bndSAX));
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        xmlSAX2InitHtmlDefaultSAXHandler(&bndSAX);
        bndSAX.startElement = startElementBnd;
        bndSAX.endElement = endElementBnd;
    } else
#endif
    {
        xmlSAXVersion(&bndSAX, 2);
        bndSAX.startElementNs = startElementNsBnd;
        bndSAX.endElementNs = endElementNsBnd;
    }

    bndSAX.internalSubset = internalSubsetBnd;
    bndSAX.reference = referenceBnd;
    bndSAX.characters = charactersBnd;
    bndSAX.cdataBlock = cdataBlockBnd;
    bndSAX.processingInstruction = processingInstructionBnd;
    bndSAX.comment = commentBnd;

    /*
     * load the document in memory and work from there.
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	ctxt = htmlCreatePushParserCtxt(&bndSAX, NULL, base, 1, filename,
	                                XML_CHAR_ENCODING_NONE);
    else
#endif
    ctxt = xmlCreatePushParserCtxt(&bndSAX, NULL, base, 1, filename);
    xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
    xmlCtxtUseOptions(ctxt, options);
    cur = 1;
    consumed = 0;
    numCallbacks = 0;
    avail = 0;
    while ((cur < size) && (numCallbacks <= 1) && (avail <= 0)) {
        int terminate = (cur + 1 >= size);
        int isText = 0;

        if (ctxt->instate == XML_PARSER_CONTENT) {
            int firstChar = (ctxt->input->end > ctxt->input->cur) ?
                            *ctxt->input->cur :
                            base[cur];

            if (options & XML_PARSE_HTML) {
                isText = ((ctxt->endCheckState) || (firstChar != '<'));
            } else {
                isText = ((firstChar != '<') && (firstChar != '&'));
            }
        }

        oldConsumed = ctxt->input->consumed +
                      (unsigned long) (ctxt->input->cur - ctxt->input->base);

        pushBoundaryCount = 0;
        pushBoundaryRefCount = 0;
        pushBoundaryCharsCount = 0;
        pushBoundaryCDataCount = 0;

#ifdef LIBXML_HTML_ENABLED
        if (options & XML_PARSE_HTML)
            htmlParseChunk(ctxt, base + cur, 1, terminate);
        else
#endif
        xmlParseChunk(ctxt, base + cur, 1, terminate);
	cur += 1;

        /*
         * Callback check: Check that only a single construct was parsed.
         */
        if (pushBoundaryRefCount > 0) {
            numCallbacks = 1;
        } else {
            numCallbacks = pushBoundaryCount;
            if (pushBoundaryCharsCount > 1) {
                if (options & XML_PARSE_HTML) {
                    /*
                     * The HTML parser can generate a mix of chars and
                     * references.
                     */
                    numCallbacks -= pushBoundaryCharsCount - 1;
                } else {
                    /*
                     * Allow two chars callbacks. This can happen when
                     * multi-byte chars are split across buffer boundaries.
                     */
                    numCallbacks -= 1;
                }
            }
            if (options & XML_PARSE_HTML) {
                /*
                 * Allow multiple cdata callbacks in HTML mode.
                 */
                if (pushBoundaryCDataCount > 1)
                    numCallbacks -= pushBoundaryCDataCount - 1;
            }
        }

        /*
         * Buffer check: If input was consumed, check that the input
         * buffer is (almost) empty.
         */
        consumed = ctxt->input->consumed +
                   (unsigned long) (ctxt->input->cur - ctxt->input->base);
        if ((ctxt->instate != XML_PARSER_DTD) &&
            (consumed >= 4) &&
            (consumed != oldConsumed)) {
            size_t max = 0;

            avail = ctxt->input->end - ctxt->input->cur;

            if ((options & XML_PARSE_HTML) &&
                (ctxt->instate == XML_PARSER_END_TAG)) {
                /* Something related to script parsing. */
                max = 3;
            } else if (isText) {
                int c = *ctxt->input->cur;

                if ((options & XML_PARSE_HTML) &&
                    (ctxt->endCheckState)) {
                    max = strlen((const char *) ctxt->name) + 2;
                } else if (c == '&') {
                    max = (options & XML_PARSE_HTML) ? 32 : 1;
                } else if (c == '<') {
                    max = 1;
                } else {
                    /* 3 bytes for partial UTF-8 */
                    max = 3;
                }
            } else if (ctxt->instate == XML_PARSER_CDATA_SECTION) {
                /* 2 bytes for terminator, 3 bytes for UTF-8 */
                max = 5;
            }

            if (avail <= max)
                avail = 0;
        }
    }
    doc = ctxt->myDoc;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
        res = 1;
    else
#endif
    res = ctxt->wellFormed;
    xmlFreeParserCtxt(ctxt);
    free((char *)base);
    if (numCallbacks > 1) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed push boundary callback test (%d@%lu-%lu): %s\n",
                numCallbacks, oldConsumed, consumed, filename);
	return(-1);
    }
    if (avail > 0) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed push boundary buffer test (%lu@%lu): %s\n",
                avail, consumed, filename);
	return(-1);
    }
    if (!res) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    else
#endif
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    xmlFreeDoc(doc);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
	if (base != NULL)
	    xmlFree((char *)base);
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	return(-1);
    }
    xmlFree((char *)base);
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    }
    return(0);
}